

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

axbStatus_t op_mat_csr_tvec(axbMat_s *A,axbVec_s *x,axbVec_s *ATx,void *aux_data)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *__s;
  size_t sVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  
  piVar3 = (int *)A->row_markers;
  pvVar4 = A->col_indices;
  pvVar5 = A->values;
  pvVar6 = x->data;
  __s = ATx->data;
  if (A->cols != 0) {
    memset(__s,0,A->cols << 3);
  }
  sVar7 = A->rows;
  if (sVar7 != 0) {
    sVar9 = 0;
    iVar8 = *piVar3;
    do {
      iVar2 = piVar3[sVar9 + 1];
      if (iVar8 < iVar2) {
        dVar1 = *(double *)((long)pvVar6 + sVar9 * 8);
        lVar10 = (long)iVar8;
        do {
          lVar11 = (long)*(int *)((long)pvVar4 + lVar10 * 4);
          *(double *)((long)__s + lVar11 * 8) =
               *(double *)((long)pvVar5 + lVar10 * 8) * dVar1 + *(double *)((long)__s + lVar11 * 8);
          lVar10 = lVar10 + 1;
        } while (iVar2 != lVar10);
      }
      sVar9 = sVar9 + 1;
      iVar8 = iVar2;
    } while (sVar9 != sVar7);
  }
  return 0;
}

Assistant:

static axbStatus_t op_mat_csr_tvec(struct axbMat_s *A, struct axbVec_s *x, struct axbVec_s *ATx, void *aux_data)
{
  (void)aux_data;

  const int    *A_row_markers = (const int*)A->row_markers;
  const int    *A_col_indices = (const int*)A->col_indices;
  const double *A_values      = (const double*)A->values;
  const double *d_x           = (const double*)x->data;

  double *d_ATx = (double*)ATx->data;

  for (size_t i=0; i<A->cols; ++i) d_ATx[i] = 0;

  for (size_t i=0; i<A->rows; ++i) {
    double xi = d_x[i];
    for (int j=A_row_markers[i]; j < A_row_markers[i+1]; ++j) {
      d_ATx[A_col_indices[j]] += A_values[j] * xi;
    }
  }

  return 0;
}